

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

Gia_Man_t * Bmc_CexPerformUnrolling(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  Gia_Man_t *p_00;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Gia_Man_t *pGVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  Gia_Obj_t *pGVar21;
  
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexTools.c"
                  ,0x8f,"Gia_Man_t *Bmc_CexPerformUnrolling(Gia_Man_t *, Abc_Cex_t *)");
  }
  p_00 = Gia_ManStart((pCex->iFrame + 1) * p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p_00->pName = pcVar11;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar11 = (char *)0x0;
  }
  else {
    sVar10 = strlen(pcVar4);
    pcVar11 = (char *)malloc(sVar10 + 1);
    strcpy(pcVar11,pcVar4);
  }
  p_00->pSpec = pcVar11;
  pGVar21 = p->pObjs;
  pGVar21->Value = 0;
  lVar16 = (long)p->nRegs;
  if (0 < lVar16) {
    pVVar13 = p->vCos;
    iVar9 = pVVar13->nSize;
    uVar19 = (ulong)(uint)(iVar9 - p->nRegs);
    do {
      if (((int)uVar19 < 0) || (iVar9 <= (int)uVar19)) goto LAB_0057bb21;
      iVar17 = pVVar13->pArray[uVar19];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) goto LAB_0057bae3;
      if (pGVar21 == (Gia_Obj_t *)0x0) break;
      pGVar21[iVar17].Value = 0;
      uVar19 = uVar19 + 1;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  Gia_ManHashAlloc(p_00);
  if (-1 < pCex->iFrame) {
    iVar9 = 0;
    do {
      pVVar13 = p->vCis;
      iVar17 = pVVar13->nSize;
      uVar20 = p->nRegs;
      uVar19 = (ulong)uVar20;
      iVar15 = iVar17 - uVar20;
      if (iVar15 != 0 && (int)uVar20 <= iVar17) {
        lVar16 = 0;
        do {
          if (iVar17 <= lVar16) goto LAB_0057bb21;
          iVar1 = pVVar13->pArray[lVar16];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0057bae3;
          pGVar21 = p->pObjs;
          if (pGVar21 == (Gia_Obj_t *)0x0) break;
          pGVar12 = Gia_ManAppendObj(p_00);
          uVar19 = *(ulong *)pGVar12;
          *(ulong *)pGVar12 = uVar19 | 0x9fffffff;
          *(ulong *)pGVar12 =
               uVar19 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) {
LAB_0057bb02:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_0057bb02;
          pGVar21[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
          lVar16 = lVar16 + 1;
          pVVar13 = p->vCis;
          iVar17 = pVVar13->nSize;
          uVar19 = (ulong)(uint)p->nRegs;
          iVar15 = iVar17 - p->nRegs;
        } while (lVar16 < iVar15);
      }
      if (0 < (int)uVar19) {
        pVVar6 = p->vCos;
        iVar1 = pVVar6->nSize;
        uVar20 = iVar1 - (int)uVar19;
        lVar16 = (long)iVar15;
        do {
          if (((int)uVar20 < 0) || (iVar1 <= (int)uVar20)) goto LAB_0057bb21;
          iVar2 = pVVar6->pArray[uVar20];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0057bae3;
          pGVar21 = p->pObjs;
          if (pGVar21 == (Gia_Obj_t *)0x0) break;
          if ((iVar15 < 0) || (iVar17 <= lVar16)) goto LAB_0057bb21;
          iVar3 = pVVar13->pArray[lVar16];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0057bae3;
          pGVar21[iVar3].Value = pGVar21[iVar2].Value;
          lVar16 = lVar16 + 1;
          uVar20 = uVar20 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      iVar17 = p->nObjs;
      if ((0 < iVar17) && (pGVar21 = p->pObjs, pGVar21 != (Gia_Obj_t *)0x0)) {
        lVar16 = 0;
        do {
          uVar19 = *(ulong *)pGVar21;
          if ((uVar19 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar19) {
            if ((int)pGVar21[-(uVar19 & 0x1fffffff)].Value < 0) goto LAB_0057bb40;
            uVar20 = (uint)(uVar19 >> 0x20);
            if ((int)pGVar21[-(ulong)(uVar20 & 0x1fffffff)].Value < 0) goto LAB_0057bb40;
            uVar20 = Gia_ManHashAnd(p_00,pGVar21[-(uVar19 & 0x1fffffff)].Value ^
                                         (uint)(uVar19 >> 0x1d) & 1,
                                    pGVar21[-(ulong)(uVar20 & 0x1fffffff)].Value ^
                                    uVar20 >> 0x1d & 1);
            pGVar21->Value = uVar20;
          }
          lVar16 = lVar16 + 1;
          iVar17 = p->nObjs;
        } while ((lVar16 < iVar17) && (pGVar21 = p->pObjs + lVar16, p->pObjs != (Gia_Obj_t *)0x0));
      }
      lVar16 = (long)p->vCos->nSize;
      if (0 < lVar16) {
        piVar7 = p->vCos->pArray;
        lVar18 = 0;
        do {
          iVar15 = piVar7[lVar18];
          if (((long)iVar15 < 0) || (iVar17 <= iVar15)) goto LAB_0057bae3;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar21 = p->pObjs + iVar15;
          if ((int)pGVar21[-(ulong)((uint)*(undefined8 *)pGVar21 & 0x1fffffff)].Value < 0) {
LAB_0057bb40:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          pGVar21->Value =
               (uint)*(undefined8 *)pGVar21 >> 0x1d & 1 ^
               pGVar21[-(ulong)((uint)*(undefined8 *)pGVar21 & 0x1fffffff)].Value;
          lVar18 = lVar18 + 1;
        } while (lVar16 != lVar18);
      }
      bVar8 = iVar9 < pCex->iFrame;
      iVar9 = iVar9 + 1;
    } while (bVar8);
  }
  Gia_ManHashStop(p_00);
  uVar20 = pCex->iPo;
  iVar9 = p->vCos->nSize;
  if (iVar9 - p->nRegs <= (int)uVar20) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar20) && ((int)uVar20 < iVar9)) {
    iVar9 = p->vCos->pArray[uVar20];
    if ((-1 < (long)iVar9) && (iVar9 < p->nObjs)) {
      Gia_ManAppendCo(p_00,p->pObjs[iVar9].Value);
      pGVar14 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar14;
    }
LAB_0057bae3:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0057bb21:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexPerformUnrolling( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k;
    assert( Gia_ManRegNum(p) > 0 );
    pNew = Gia_ManStart( (pCex->iFrame + 1) * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachRi( p, pObj, k )
        pObj->Value = 0;
    Gia_ManHashAlloc( pNew );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->Value = pObjRi->Value;
        Gia_ManForEachAnd( p, pObj, k )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, k )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
    }
    Gia_ManHashStop( pNew );
    pObj = Gia_ManPo(p, pCex->iPo);
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}